

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::TextNode::~TextNode(TextNode *this)

{
  TextNode *in_RDI;
  
  ~TextNode(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

TextNode(const Location & loc, const std::string& t) : TemplateNode(loc), text(t) {}